

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

int Imf_3_4::getScanlineChunkOffsetTableSize(Header *header)

{
  int iVar1;
  Box2i *pBVar2;
  Compression *pCVar3;
  
  pBVar2 = Header::dataWindow(header);
  pCVar3 = Header::compression(header);
  iVar1 = numLinesInBuffer(*pCVar3);
  return (int)((((long)(pBVar2->max).y + (long)iVar1) - (long)(pBVar2->min).y) / (long)iVar1);
}

Assistant:

int
getScanlineChunkOffsetTableSize (const Header& header)
{
    const Box2i& dataWindow = header.dataWindow ();

    //
    // use int64_t types to prevent overflow in lineOffsetSize for images with
    // extremely high dataWindows
    //
    int64_t linesInBuffer = numLinesInBuffer (header.compression ());

    int64_t lineOffsetSize =
        (static_cast<int64_t> (dataWindow.max.y) -
         static_cast<int64_t> (dataWindow.min.y) + linesInBuffer) /
        linesInBuffer;

    return static_cast<int> (lineOffsetSize);
}